

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O0

void __thiscall
BCL::
HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
::set_entry(HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
            *this,size_type slot,HME *entry)

{
  size_type sVar1;
  runtime_error *this_00;
  GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
  local_50;
  GlobalPtr<void> local_40;
  HME *local_20;
  HME *entry_local;
  size_type slot_local;
  HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
  *this_local;
  
  local_20 = entry;
  entry_local = (HME *)slot;
  slot_local = (size_type)this;
  sVar1 = capacity(this);
  if (sVar1 <= slot) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"slot too large!!!");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_50 = slot_ptr(this,(size_t)entry_local);
  local_40 = GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
             ::operator_GlobalPtr<true,_nullptr>(&local_50);
  memcpy((void *)local_40.rank,(void *)local_40.ptr,(size_t)local_20);
  return;
}

Assistant:

void set_entry(size_type slot, const HME &entry) {
    if (slot >= capacity()) {
      throw std::runtime_error("slot too large!!!");
    }
    BCL::memcpy(slot_ptr(slot), &entry, offsetof(HME, used));
  }